

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O1

void TIFFSwabArrayOfLong8(uint64_t *lp,tmsize_t n)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  long lVar4;
  undefined1 *puVar5;
  
  if (0 < n) {
    puVar5 = (undefined1 *)((long)lp + 7);
    lVar4 = n + 1;
    do {
      uVar2 = *puVar5;
      *puVar5 = puVar5[-7];
      puVar5[-7] = uVar2;
      uVar3 = *(ushort *)(puVar5 + -6);
      *(ushort *)(puVar5 + -6) = *(ushort *)(puVar5 + -2) << 8 | *(ushort *)(puVar5 + -2) >> 8;
      *(ushort *)(puVar5 + -2) = uVar3 << 8 | uVar3 >> 8;
      puVar1 = (ushort *)(puVar5 + -4);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      puVar5 = puVar5 + 8;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  return;
}

Assistant:

void TIFFSwabArrayOfLong8(register uint64_t *lp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(uint64_t) == 8);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)lp;
        t = cp[7];
        cp[7] = cp[0];
        cp[0] = t;
        t = cp[6];
        cp[6] = cp[1];
        cp[1] = t;
        t = cp[5];
        cp[5] = cp[2];
        cp[2] = t;
        t = cp[4];
        cp[4] = cp[3];
        cp[3] = t;
        lp++;
    }
}